

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

int checkTestFile(char *filename)

{
  int iVar1;
  undefined1 local_a8 [8];
  stat buf;
  char *filename_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)filename;
  iVar1 = stat64(filename,(stat64 *)local_a8);
  if (iVar1 == -1) {
    filename_local._4_4_ = 0;
  }
  else if (((uint)buf.st_nlink & 0xf000) == 0x8000) {
    filename_local._4_4_ = 1;
  }
  else {
    filename_local._4_4_ = 0;
  }
  return filename_local._4_4_;
}

Assistant:

static int checkTestFile(const char *filename) {
    struct stat buf;

    if (stat(filename, &buf) == -1)
        return(0);

#if defined(_WIN32)
    if (!(buf.st_mode & _S_IFREG))
        return(0);
#else
    if (!S_ISREG(buf.st_mode))
        return(0);
#endif

    return(1);
}